

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O2

void __thiscall pg::SSPMSolver::run(SSPMSolver *this,int n_bits,int depth,int player)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  ostream *poVar6;
  Game *pGVar7;
  long lVar8;
  char *pcVar9;
  int v;
  int v_1;
  uint v_00;
  int v_2;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  int s;
  int local_40;
  int s_1;
  
  this->l = n_bits;
  this->h = depth;
  bitset::resize(&this->pm_b,(long)n_bits * ((this->super_Solver).game)->n_vertices);
  iVar2 = this->l;
  uVar4 = ((this->super_Solver).game)->n_vertices * (long)iVar2;
  piVar5 = (int *)operator_new__(-(ulong)(uVar4 >> 0x3e != 0) | uVar4 * 4);
  this->pm_d = piVar5;
  bitset::resize(&this->tmp_b,(long)iVar2);
  sVar10 = (size_t)this->l;
  uVar4 = 0xffffffffffffffff;
  uVar11 = sVar10 * 4;
  if ((long)sVar10 < 0) {
    uVar11 = uVar4;
  }
  piVar5 = (int *)operator_new__(uVar11);
  this->tmp_d = piVar5;
  bitset::resize(&this->best_b,sVar10);
  sVar10 = (size_t)this->l;
  uVar11 = sVar10 * 4;
  if ((long)sVar10 < 0) {
    uVar11 = uVar4;
  }
  piVar5 = (int *)operator_new__(uVar11);
  this->best_d = piVar5;
  bitset::resize(&this->test_b,sVar10);
  uVar11 = (long)this->l * 4;
  if (-1 < (long)this->l) {
    uVar4 = uVar11;
  }
  piVar5 = (int *)operator_new__(uVar4);
  this->test_d = piVar5;
  memset(this->pm_d,0,uVar11 * ((this->super_Solver).game)->n_vertices);
  uVar4 = (ulong)(uint)((this->super_Solver).game)->n_vertices;
  while( true ) {
    uVar4 = uVar4 - 1;
    v_00 = (uint)uVar4;
    if ((int)v_00 < 0) break;
    if ((((this->super_Solver).disabled)->_bits[(v_00 & 0x7fffffff) >> 6] >> (uVar4 & 0x3f) & 1) ==
        0) {
      this->lift_attempt = this->lift_attempt + 1;
      bVar1 = lift(this,v_00,-1,&s,player);
      if (bVar1) {
        this->lift_count = this->lift_count + 1;
        pGVar7 = (this->super_Solver).game;
        piVar5 = pGVar7->_inedges + pGVar7->_firstins[v_00 & 0x7fffffff];
        while( true ) {
          iVar2 = *piVar5;
          uVar11 = (ulong)iVar2;
          if (uVar11 == 0xffffffffffffffff) break;
          if ((((this->super_Solver).disabled)->_bits[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
            this->lift_attempt = this->lift_attempt + 1;
            bVar1 = lift(this,iVar2,v_00,&s_1,player);
            if (bVar1) {
              this->lift_count = this->lift_count + 1;
              todo_push(this,iVar2);
            }
          }
          piVar5 = piVar5 + 1;
        }
      }
    }
  }
  while ((this->Q).pointer != 0) {
    iVar2 = todo_pop(this);
    pGVar7 = (this->super_Solver).game;
    piVar5 = pGVar7->_inedges + pGVar7->_firstins[iVar2];
    while( true ) {
      iVar3 = *piVar5;
      uVar4 = (ulong)iVar3;
      if (uVar4 == 0xffffffffffffffff) break;
      if ((((this->super_Solver).disabled)->_bits[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
        this->lift_attempt = this->lift_attempt + 1;
        bVar1 = lift(this,iVar3,iVar2,&s,player);
        if (bVar1) {
          this->lift_count = this->lift_count + 1;
          todo_push(this,iVar3);
        }
      }
      piVar5 = piVar5 + 1;
    }
  }
  lVar12 = 0;
  uVar4 = 0;
  while( true ) {
    pGVar7 = (this->super_Solver).game;
    lVar8 = pGVar7->n_vertices;
    if (lVar8 <= (long)uVar4) break;
    if (((((((this->super_Solver).disabled)->_bits[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) &&
         (iVar2 = (int)uVar4, this->pm_d[(long)iVar2 * (long)this->l] != -1)) &&
        (iVar3 = Solver::owner(&this->super_Solver,iVar2), iVar3 != player)) &&
       (bVar1 = lift(this,iVar2,-1,(int *)((long)((this->super_Solver).game)->strategy + lVar12),
                     player), bVar1)) {
      poVar6 = std::operator<<((this->super_Solver).logger,"error: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
      poVar6 = std::operator<<(poVar6," is not progressive!");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    uVar4 = uVar4 + 1;
    lVar12 = lVar12 + 4;
  }
  if ((this->super_Solver).trace != 0) {
    for (uVar4 = 0; (long)uVar4 < lVar8; uVar4 = uVar4 + 1) {
      if ((((this->super_Solver).disabled)->_bits[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) {
        poVar6 = std::operator<<((this->super_Solver).logger,"\x1b[1m");
        _s = (this->super_Solver).game;
        iVar3 = (int)uVar4;
        local_40 = iVar3;
        poVar6 = operator<<(poVar6,(_label_vertex *)&s);
        iVar2 = Solver::owner(&this->super_Solver,iVar3);
        pcVar9 = " (odd)";
        if (iVar2 == 0) {
          pcVar9 = " (even)";
        }
        poVar6 = std::operator<<(poVar6,pcVar9);
        std::operator<<(poVar6,"\x1b[m:");
        stream_pm(this,(this->super_Solver).logger,iVar3);
        if ((this->pm_d[(long)iVar3 * (long)this->l] != -1) &&
           (iVar2 = Solver::owner(&this->super_Solver,iVar3), iVar2 != player)) {
          poVar6 = std::operator<<((this->super_Solver).logger," => ");
          _s = (this->super_Solver).game;
          local_40 = _s->strategy[uVar4];
          operator<<(poVar6,(_label_vertex *)&s);
        }
        std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
        pGVar7 = (this->super_Solver).game;
        lVar8 = pGVar7->n_vertices;
      }
    }
  }
  for (uVar4 = 0; (long)uVar4 < lVar8; uVar4 = uVar4 + 1) {
    if (((((this->super_Solver).disabled)->_bits[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0) &&
       (this->pm_d[(long)(int)uVar4 * (long)this->l] != -1)) {
      Solver::solve(&this->super_Solver,(int)uVar4,1 - player,pGVar7->strategy[uVar4]);
      pGVar7 = (this->super_Solver).game;
      lVar8 = pGVar7->n_vertices;
    }
  }
  Solver::flush(&this->super_Solver);
  if (this->pm_d != (int *)0x0) {
    operator_delete__(this->pm_d);
  }
  if (this->tmp_d != (int *)0x0) {
    operator_delete__(this->tmp_d);
  }
  if (this->best_d != (int *)0x0) {
    operator_delete__(this->best_d);
  }
  if (this->test_d != (int *)0x0) {
    operator_delete__(this->test_d);
  }
  return;
}

Assistant:

void
SSPMSolver::run(int n_bits, int depth, int player)
{
    l = n_bits;
    h = depth;

    pm_b.resize(l*nodecount());
    pm_d = new int[l*nodecount()];

    tmp_b.resize(l);
    tmp_d = new int[l];

    best_b.resize(l);
    best_d = new int[l];

    test_b.resize(l);
    test_d = new int[l];

    // initialize progress measures
    // pm_b.reset(); // standard set to 0 already
    memset(pm_d, 0, sizeof(int[l*nodecount()])); // every bit in the top ( = min )

    // lift_counters = new uint64_t[nodecount()];
    // memset(lift_counters, 0, sizeof(uint64_t[nodecount()]));

    for (int n=nodecount()-1; n>=0; n--) {
        if (disabled[n]) continue;
        lift_attempt++;
        int s;
        if (lift(n, -1, s, player)) {
            lift_count++;
            // lift_counters[n]++;
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (disabled[from]) continue;
                lift_attempt++;
                int s;
                if (lift(from, n, s, player)) {
                    lift_count++;
                    // lift_counters[from]++;
                    todo_push(from);
                }
            }
        }
    }

    while (!Q.empty()) {
        int n = todo_pop();
        for (auto curedge = ins(n); *curedge != -1; curedge++) {
            int from = *curedge;
            if (disabled[from]) continue;
            lift_attempt++;
            int s;
            if (lift(from, n, s, player)) {
                lift_count++;
                // lift_counters[from]++;
                todo_push(from);
            }
        }
    }

    /**
     * Derive strategies.
     */

    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        if (pm_d[l*v] != -1) {
            if (owner(v) != player) {
                // TODO: don't rely on the strategy array in the Game class
                if (lift(v, -1, game.getStrategy()[v], player)) logger << "error: " << v << " is not progressive!" << std::endl;
            }
        }
    }

    if (trace) {
        for (int v=0; v<nodecount(); v++) {
            if (disabled[v]) continue;

            logger << "\033[1m" << label_vertex(v) << (owner(v)?" (odd)":" (even)") << "\033[m:";
            stream_pm(logger, v);

            if (pm_d[l*v] != -1) {
                if (owner(v) != player) {
                    logger << " => " << label_vertex(game.getStrategy(v));
                }
            }

            logger << std::endl;
        }
    }

    /**
     * Mark solved.
     */

    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        if (pm_d[l*v] != -1) Solver::solve(v, 1-player, game.getStrategy(v));
    }

    Solver::flush();

    /*
    {
        uint64_t hi_c = 0;
        int hi_n = -1;
        for (int i=0; i<nodecount(); i++) {
            if (hi_c < lift_counters[i]) {
                hi_c = lift_counters[i];
                hi_n = i;
            }
        }
        logger << "highest counter: " << hi_c << " lifts for vertex " << label_vertex(hi_n) << std::endl;
    }
    */

    delete[] pm_d;
    delete[] tmp_d;
    delete[] best_d;
    delete[] test_d;
}